

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::getp_compareTo(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  vm_val_t *pvVar4;
  CVmObject *pCVar5;
  vm_date_ext *pvVar6;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjDate *in_RDI;
  int32_t odaytime;
  int32_t odayno;
  int32_t daytime;
  int32_t dayno;
  CVmObjDate *other;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  vm_val_t *in_stack_ffffffffffffff88;
  CVmObject *local_70;
  int local_64;
  
  if (in_RCX == (int *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = *in_RCX;
  }
  if ((getp_compareTo(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar3 = __cxa_guard_acquire(&getp_compareTo(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar3 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_compareTo::desc,1);
    __cxa_guard_release(&getp_compareTo(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar3 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff88,
                     (uint *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78);
  if (iVar3 != 0) {
    return 1;
  }
  pvVar4 = CVmStack::get(0);
  if (pvVar4->typ == VM_OBJ) {
    CVmStack::get(0);
    pCVar5 = vm_objp(0);
    iVar3 = (*pCVar5->_vptr_CVmObject[1])(pCVar5,metaclass_reg_);
    if (iVar3 != 0) {
      CVmStack::get(0);
      local_70 = vm_objp(0);
      goto LAB_002eb8b1;
    }
  }
  local_70 = (CVmObject *)0x0;
LAB_002eb8b1:
  if (local_70 != (CVmObject *)0x0) {
    pvVar6 = get_ext(in_RDI);
    iVar3 = pvVar6->dayno;
    pvVar6 = get_ext(in_RDI);
    iVar1 = pvVar6->daytime;
    pvVar6 = get_ext((CVmObjDate *)local_70);
    iVar2 = pvVar6->dayno;
    pvVar6 = get_ext((CVmObjDate *)local_70);
    if (iVar3 == iVar2) {
      iVar3 = iVar1 - pvVar6->daytime;
    }
    else {
      iVar3 = iVar3 - iVar2;
    }
    vm_val_t::set_int(in_RDX,iVar3);
    CVmStack::discard(local_64);
    return 1;
  }
  err_throw(0);
}

Assistant:

int CVmObjDate::getp_compareTo(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the other date */
    CVmObjDate *other = vm_val_cast(CVmObjDate, G_stk->get(0));
    if (other == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the respective dates */
    int32_t dayno = get_ext()->dayno;
    int32_t daytime = get_ext()->daytime;
    int32_t odayno = other->get_ext()->dayno;
    int32_t odaytime = other->get_ext()->daytime;

    /* do the comparison */
    retval->set_int(dayno != odayno ? dayno - odayno : daytime - odaytime);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}